

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  string *psVar1;
  ostream *poVar2;
  
  poVar2 = (this->super_StreamingReporterBase).stream;
  psVar1 = getDashes_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  std::operator<<(poVar2,"\n");
  (**(code **)(*Colour::impl + 0x10))(Colour::impl,1);
  printHeaderString(this,_name,0);
  Colour::~Colour((Colour *)this);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getDashes() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }